

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUISetting.cpp
# Opt level: O3

void __thiscall GUISetting::acceptSettings(GUISetting *this)

{
  map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
  *this_00;
  _Rb_tree_color _Var1;
  mapped_type mVar2;
  _Rb_tree_color _Var3;
  _Rb_tree_color _Var4;
  _Rb_tree_color _Var5;
  _Rb_tree_node_base *p_Var6;
  int *piVar7;
  byte bVar8;
  int iVar9;
  BoardMode BVar10;
  mapped_type *pmVar11;
  undefined1 *puVar12;
  _Rb_tree_node_base *p_Var13;
  _Rb_tree_node_base *p_Var14;
  bool bVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  OptionsData newOptions;
  undefined8 local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  mapped_type local_80;
  OptionsData local_7c;
  QArrayData *local_68 [2];
  undefined8 local_58;
  key_type local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  iVar9 = QAbstractSlider::value();
  local_98 = (QArrayData *)(long)iVar9;
  pmVar11 = std::
            map<unsigned_long,_TileSize,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TileSize>_>_>
            ::at(&Maps::sliderTileSize,&local_98);
  mVar2 = *pmVar11;
  local_80 = (this->currentOptions).tileSize;
  local_7c.tileSize = mVar2;
  if ((mVar2 == local_80) || (this->boardMode != GRAPHIC)) {
    local_98 = (QArrayData *)((ulong)local_98 & 0xffffffff00000000);
    std::
    map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
    ::operator[](&this->mapGraphicMode,(key_type *)&local_98);
    bVar8 = QAbstractButton::isChecked();
    local_7c.graphicMode = (GraphicMode)(bVar8 ^ 1);
    this_00 = &this->mapImageToLoad;
    local_98 = (QArrayData *)((ulong)local_98 & 0xffffffff00000000);
    std::
    map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
    ::operator[](this_00,(key_type *)&local_98);
    local_7c.imageToLoad_4 = (bool)QAbstractButton::isChecked();
    local_98._0_4_ = CROPPED;
    std::
    map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
    ::operator[](this_00,(key_type *)&local_98);
    local_7c.imageToLoad_5 = (bool)QAbstractButton::isChecked();
    local_98._0_4_ = 2;
    std::
    map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
    ::operator[](this_00,(key_type *)&local_98);
    local_7c.imageToLoad_6 = (bool)QAbstractButton::isChecked();
    local_98._0_4_ = 3;
    std::
    map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
    ::operator[](this_00,(key_type *)&local_98);
    local_7c.imageToLoad_7 = (bool)QAbstractButton::isChecked();
    local_98 = (QArrayData *)((ulong)local_98._4_4_ << 0x20);
    std::
    map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>
    ::operator[](&this->mapNumberOnImage,(key_type *)&local_98);
    QAbstractButton::group();
    puVar12 = (undefined1 *)QButtonGroup::checkedButton();
    p_Var6 = (this->mapNumberOnImage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var13 = p_Var6;
        (p_Var14 = p_Var6,
        (_Rb_tree_header *)p_Var13 != &(this->mapNumberOnImage)._M_t._M_impl.super__Rb_tree_header
        && (p_Var14 = p_Var13, &p_Var13[1]._M_parent != (_Base_ptr *)puVar12));
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
    }
    _Var3 = p_Var14[1]._M_color;
    local_98 = (QArrayData *)((ulong)local_98 & 0xffffffff00000000);
    local_7c.numberColor = _Var3;
    std::
    map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>
    ::operator[](&this->mapTileColor,(key_type *)&local_98);
    QAbstractButton::group();
    puVar12 = (undefined1 *)QButtonGroup::checkedButton();
    p_Var6 = (this->mapTileColor)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var13 = p_Var6;
        (p_Var14 = p_Var6,
        (_Rb_tree_header *)p_Var13 != &(this->mapTileColor)._M_t._M_impl.super__Rb_tree_header &&
        (p_Var14 = p_Var13, &p_Var13[1]._M_parent != (_Base_ptr *)puVar12));
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
    }
    bVar15 = mVar2 != local_80;
    _Var4 = p_Var14[1]._M_color;
    _Var1 = (this->currentOptions).numberColor;
    _Var5 = (this->currentOptions).squareColor;
    local_7c.squareColor = _Var4;
    Options::saveOptions(&local_7c);
    BVar10 = this->boardMode;
    if ((bVar15 && BVar10 == NUMERIC) || (_Var3 != _Var1 && BVar10 == GRAPHIC)) {
      Fifteen::redrawTiles(this->owner);
      BVar10 = this->boardMode;
    }
    if ((_Var4 != _Var5) && (BVar10 == NUMERIC)) {
      Fifteen::setColor(this->owner);
    }
    QWidget::close();
  }
  else {
    QVar16.m_data = (storage_type *)0x0;
    QVar16.m_size = (qsizetype)&local_98;
    QString::fromUtf8(QVar16);
    local_68[0] = local_98;
    local_58 = local_88;
    QVar17.m_data = (storage_type *)0x52;
    QVar17.m_size = (qsizetype)&local_98;
    QString::fromUtf8(QVar17);
    local_48 = (key_type)local_98;
    uStack_44 = local_98._4_4_;
    uStack_40 = uStack_90;
    uStack_3c = uStack_8c;
    local_38 = local_88;
    QMessageBox::information(this,local_68,&local_48,0x400,0);
    piVar7 = (int *)CONCAT44(uStack_44,local_48);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_44,local_48),2,8);
      }
    }
    if (local_68[0] != (QArrayData *)0x0) {
      LOCK();
      (local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_68[0],2,8);
      }
    }
  }
  return;
}

Assistant:

void GUISetting::acceptSettings()
{
    OptionsData newOptions;

    newOptions.tileSize = Maps::sliderTileSize.at( slider->value() );
    bool tileSizeChanged = newOptions.tileSize != currentOptions.tileSize;
    if ( tileSizeChanged && boardMode == BoardMode::GRAPHIC )
    {
        QMessageBox::information( this, "",
                                  "\nSize of a tile can not be changed in graphic mode\t \nwhen an image has been loaded" );
        return;
    }

    const auto getChecked = [](const auto& mapRadio, const QButtonGroup* group)
    {
        QAbstractButton* checked = group->checkedButton();
        for ( const auto& [key, value] : mapRadio )
        {
            if ( &value == checked )
            {
                return key;
            }
        }
        return mapRadio.begin()->first;
    };

    newOptions.graphicMode = mapGraphicMode[GraphicMode::SCALED].isChecked() ? GraphicMode::SCALED : GraphicMode::CROPPED;
    newOptions.imageToLoad_4 = mapImageToLoad[BoardSize::FOUR].isChecked();
    newOptions.imageToLoad_5 = mapImageToLoad[BoardSize::FIVE].isChecked();
    newOptions.imageToLoad_6 = mapImageToLoad[BoardSize::SIX].isChecked();
    newOptions.imageToLoad_7 = mapImageToLoad[BoardSize::SEVEN].isChecked();
    newOptions.numberColor = getChecked( mapNumberOnImage, mapNumberOnImage[NumberColor::NO].group() );
    newOptions.squareColor = getChecked( mapTileColor, mapTileColor[TileColor::BLUE].group() );

    bool numberImageChanged = newOptions.numberColor != currentOptions.numberColor;
    bool colorChanged = newOptions.squareColor != currentOptions.squareColor;

    Options::saveOptions( newOptions );

    if (( tileSizeChanged && boardMode == BoardMode::NUMERIC  ) ||
        ( numberImageChanged && boardMode == BoardMode::GRAPHIC ))
    {
        owner.redrawTiles();
    }
    if ( colorChanged && boardMode == BoardMode::NUMERIC )
    {
        owner.setColor();
    }
    close();
}